

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

void __thiscall Lib::DArray<int>::expand(DArray<int> *this,size_t s)

{
  size_t sVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int *__s;
  void **head;
  ulong uVar7;
  
  uVar4 = this->_capacity;
  if (uVar4 < s) {
    uVar7 = uVar4 * 2;
    if (uVar7 < s || uVar7 - s == 0) {
      uVar7 = s;
    }
    uVar5 = uVar7 * 4 + 0xf & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      piVar3 = (int *)FixedSizeAllocator<8UL>::alloc
                                ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar5 < 0x11) {
      piVar3 = (int *)FixedSizeAllocator<16UL>::alloc
                                ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
      ;
    }
    else if (uVar5 < 0x19) {
      piVar3 = (int *)FixedSizeAllocator<24UL>::alloc
                                ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30))
      ;
    }
    else if (uVar5 < 0x21) {
      piVar3 = (int *)FixedSizeAllocator<32UL>::alloc
                                ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48))
      ;
    }
    else if (uVar5 < 0x31) {
      piVar3 = (int *)FixedSizeAllocator<48UL>::alloc
                                ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60))
      ;
    }
    else if (uVar5 < 0x41) {
      piVar3 = (int *)FixedSizeAllocator<64UL>::alloc
                                ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78))
      ;
    }
    else {
      piVar3 = (int *)::operator_new(uVar5,0x10);
    }
    sVar1 = this->_size;
    piVar2 = this->_array;
    this->_capacity = uVar7;
    this->_array = piVar3;
    __s = piVar3;
    if (sVar1 != 0) {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)piVar3 + lVar6) = *(undefined4 *)((long)piVar2 + lVar6);
        lVar6 = lVar6 + 4;
      } while (sVar1 << 2 != lVar6);
      __s = (int *)(lVar6 + (long)piVar3);
    }
    if (__s != piVar3 + uVar7) {
      memset(__s,0,((long)piVar3 + (uVar7 * 4 - (long)__s) + -4 & 0xfffffffffffffffc) + 4);
    }
    this->_size = s;
    if (piVar2 != (int *)0x0) {
      uVar4 = uVar4 * 4 + 0xf & 0xfffffffffffffff0;
      if (uVar4 == 0) {
        *(undefined8 *)piVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = piVar2;
      }
      else if (uVar4 < 0x11) {
        *(undefined8 *)piVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = piVar2;
      }
      else if (uVar4 < 0x19) {
        *(undefined8 *)piVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = piVar2;
      }
      else if (uVar4 < 0x21) {
        *(undefined8 *)piVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = piVar2;
      }
      else if (uVar4 < 0x31) {
        *(undefined8 *)piVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = piVar2;
      }
      else {
        if (0x40 < uVar4) {
          operator_delete(piVar2,0x10);
          return;
        }
        *(undefined8 *)piVar2 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = piVar2;
      }
    }
  }
  else {
    this->_size = s;
  }
  return;
}

Assistant:

void expand(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return;
    }

    size_t oldCapacity=_capacity;
    size_t newCapacity=std::max(s, oldCapacity*2);
    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");

    C* oldArr = _array;

    _capacity = newCapacity;
    _array = static_cast<C*>(mem);

    C* optr=oldArr;
    C* nptr=_array;
    C* firstEmpty=_array+_size;
    C* afterLast=_array+_capacity;

    while(nptr!=firstEmpty) {
      C *oldAddr = optr++, *newAddr = nptr++;
      ::new (newAddr) C(std::move(*oldAddr));
      oldAddr->~C();
    }
    while(nptr!=afterLast) {
      ::new (nptr++) C();
    }
    _size = s;

    if(oldArr) {
      DEALLOC_KNOWN(oldArr,sizeof(C)*oldCapacity,"DArray<>");
    }

  }